

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbd.c
# Opt level: O2

int universal_argument(int f,int n)

{
  uint c;
  int iVar1;
  PF funct;
  long lVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  KEYMAP *local_40;
  KEYMAP *curmap;
  
  uVar5 = (ulong)(uint)(n << 2);
  uVar4 = 4;
  if ((f & 1U) != 0) {
    uVar4 = uVar5;
  }
  curmap._4_4_ = f;
  while( true ) {
    iVar3 = (int)uVar5;
    c = getkey(1);
    key.k_chars[0] = (KCHAR)c;
    key.k_count = 1;
    iVar1 = (int)uVar4;
    if (c == 0x2d) {
      iVar1 = negative_argument(curmap._4_4_,iVar1);
      return iVar1;
    }
    if (c - 0x30 < 10) break;
    local_40 = curbp->b_modes[curbp->b_nmodes]->p_map;
    while( true ) {
      uVar5 = (ulong)c;
      funct = doscan(local_40,c,&local_40);
      if (funct != (PF)0x0) break;
      c = getkey(1);
      lVar2 = (long)key.k_count;
      key.k_count = key.k_count + 1;
      key.k_chars[lVar2] = (KCHAR)c;
    }
    if (funct != universal_argument) {
      if (macrocount < 0xff && macrodef != 0) {
        iVar3 = macrocount + -1 + (uint)((curmap._4_4_ & 7) == 0);
        macro[iVar3].m_count = iVar1;
        macrocount = iVar3 + 2;
        macro[(long)iVar3 + 1].m_funct = funct;
      }
      iVar1 = mgwrap(funct,1,iVar1);
      return iVar1;
    }
    uVar4 = (ulong)(uint)(iVar1 << 2);
  }
  iVar1 = digit_argument(curmap._4_4_,iVar3);
  return iVar1;
}

Assistant:

int
universal_argument(int f, int n)
{
	KEYMAP	*curmap;
	PF	 funct;
	int	 c, nn = 4;

	if (f & FFUNIV)
		nn *= n;
	for (;;) {
		key.k_chars[0] = c = getkey(TRUE);
		key.k_count = 1;
		if (c == '-')
			return (negative_argument(f, nn));
		if (c >= '0' && c <= '9')
			return (digit_argument(f, nn));
		curmap = curbp->b_modes[curbp->b_nmodes]->p_map;
		while ((funct = doscan(curmap, c, &curmap)) == NULL) {
			key.k_chars[key.k_count++] = c = getkey(TRUE);
		}
		if (funct != universal_argument) {
			if (macrodef && macrocount < MAXMACRO - 1) {
				if (f & FFARG)
					macrocount--;
				macro[macrocount++].m_count = nn;
				macro[macrocount++].m_funct = funct;
			}
			return (mgwrap(funct, FFUNIV, nn));
		}
		nn <<= 2;
	}
}